

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::NegativePartialUpdateTest::deinit(NegativePartialUpdateTest *this)

{
  deUint32 dVar1;
  deBool dVar2;
  Library *pLVar3;
  Library *egl;
  NegativePartialUpdateTest *this_local;
  
  pLVar3 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  if (this->m_eglContext != (EGLContext)0x0) {
    do {
      (*pLVar3->_vptr_Library[0x27])(pLVar3,this->m_eglDisplay,0,0);
      dVar1 = (*pLVar3->_vptr_Library[0x1f])();
      eglu::checkError(dVar1,
                       "makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                       ,0xb7);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      (*pLVar3->_vptr_Library[0x13])(pLVar3,this->m_eglDisplay,this->m_eglContext);
      dVar1 = (*pLVar3->_vptr_Library[0x1f])();
      eglu::checkError(dVar1,"destroyContext(m_eglDisplay, m_eglContext)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                       ,0xb8);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    this->m_eglContext = (EGLContext)0x0;
  }
  if (this->m_eglSurface != (EGLSurface)0x0) {
    do {
      (*pLVar3->_vptr_Library[0x16])(pLVar3,this->m_eglDisplay,this->m_eglSurface);
      dVar1 = (*pLVar3->_vptr_Library[0x1f])();
      eglu::checkError(dVar1,"destroySurface(m_eglDisplay, m_eglSurface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                       ,0xbe);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    this->m_eglSurface = (EGLSurface)0x0;
  }
  if (this->m_eglDisplay != (EGLDisplay)0x0) {
    do {
      (*pLVar3->_vptr_Library[0x34])(pLVar3,this->m_eglDisplay);
      dVar1 = (*pLVar3->_vptr_Library[0x1f])();
      eglu::checkError(dVar1,"terminate(m_eglDisplay)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                       ,0xc4);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    this->m_eglDisplay = (EGLDisplay)0x0;
  }
  if (this->m_window != (NativeWindow *)0x0) {
    (*this->m_window->_vptr_NativeWindow[1])();
  }
  this->m_window = (NativeWindow *)0x0;
  return;
}

Assistant:

void NegativePartialUpdateTest::deinit (void)
{
	const Library& egl = m_eglTestCtx.getLibrary();

	if (m_eglContext != EGL_NO_CONTEXT)
	{
		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		EGLU_CHECK_CALL(egl, destroyContext(m_eglDisplay, m_eglContext));
		m_eglContext = EGL_NO_CONTEXT;
	}

	if (m_eglSurface != EGL_NO_SURFACE)
	{
		EGLU_CHECK_CALL(egl, destroySurface(m_eglDisplay, m_eglSurface));
		m_eglSurface = EGL_NO_SURFACE;
	}

	if (m_eglDisplay != EGL_NO_DISPLAY)
	{
		EGLU_CHECK_CALL(egl, terminate(m_eglDisplay));
		m_eglDisplay = EGL_NO_DISPLAY;
	}

	delete m_window;
	m_window = DE_NULL;
}